

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

StepStatus __thiscall adios2::Engine::BeginStep(Engine *this,StepMode mode,float timeoutSeconds)

{
  Engine *pointer;
  StepStatus SVar1;
  allocator local_45;
  float local_44;
  string local_40;
  
  pointer = this->m_Engine;
  local_44 = timeoutSeconds;
  std::__cxx11::string::string
            ((string *)&local_40,"in call to Engine::BeginStep(const StepMode, const float)",
             &local_45);
  helper::CheckForNullptr<adios2::core::Engine>(pointer,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  SVar1 = (**(code **)(*(long *)this->m_Engine + 0x18))(local_44,this->m_Engine,mode);
  return SVar1;
}

Assistant:

StepStatus Engine::BeginStep(const StepMode mode, const float timeoutSeconds)
{
    helper::CheckForNullptr(m_Engine, "in call to Engine::BeginStep(const StepMode, const float)");
    return m_Engine->BeginStep(mode, timeoutSeconds);
}